

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *centroidalMomentumJacobian)

{
  FrameVelocityRepresentation FVar1;
  bool bVar2;
  long lVar3;
  Position *pPVar4;
  long lVar5;
  Index inner;
  long lVar6;
  pointer peVar7;
  element_type *peVar8;
  Index col;
  long lVar9;
  double *pdVar10;
  pointer peVar11;
  element_type *peVar12;
  double *pdVar13;
  element_type *peVar14;
  index_type iVar15;
  Index dstCols;
  long lVar16;
  long lVar17;
  double *pdVar18;
  Position com;
  Transform com_T_base_in_base;
  PlainObjectBase<Eigen::Matrix<double,_6,__1,_0,_6,__1>_> local_278 [5];
  KinDynComputations local_228;
  Position local_210 [24];
  Rotation local_1f8 [24];
  Rotation local_1e0 [40];
  double local_1b8 [31];
  Transform local_c0 [96];
  MatrixView<double> local_60;
  
  if ((centroidalMomentumJacobian->m_rows == 6) &&
     (lVar16 = centroidalMomentumJacobian->m_cols, lVar3 = iDynTree::Model::getNrOfDOFs(),
     lVar16 == lVar3 + 6)) {
    local_60.m_storage = centroidalMomentumJacobian->m_storage;
    local_60.m_rows = centroidalMomentumJacobian->m_rows;
    local_60.m_cols = centroidalMomentumJacobian->m_cols;
    local_60.m_storageOrder = centroidalMomentumJacobian->m_storageOrder;
    local_60.m_innerStride = centroidalMomentumJacobian->m_innerStride;
    local_60.m_outerStride = centroidalMomentumJacobian->m_outerStride;
    bVar2 = getLinearAngularMomentumJacobian(this,&local_60);
    if (bVar2) {
      getCenterOfMassPosition(&local_228);
      iDynTree::FreeFloatingPos::worldBasePos();
      pPVar4 = (Position *)iDynTree::Transform::getPosition();
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      FVar1 = this->pimpl->m_frameVelRepr;
      if (FVar1 == INERTIAL_FIXED_REPRESENTATION) {
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-((Position *)local_278);
        iDynTree::Transform::Transform(local_c0,local_1e0,(Position *)local_278);
        iDynTree::Transform::asAdjointTransformWrench();
        lVar16 = centroidalMomentumJacobian->m_cols;
        if (centroidalMomentumJacobian->m_storageOrder == ColumnMajor) {
          iVar15 = centroidalMomentumJacobian->m_rows;
          lVar3 = 1;
        }
        else {
          iVar15 = 1;
          lVar3 = lVar16;
        }
        peVar7 = centroidalMomentumJacobian->m_storage;
        local_278[0].m_storage.m_data = (element_type *)0x0;
        local_278[0].m_storage.m_cols = 0;
        if (lVar16 != 0) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize
                    (local_278,6,lVar16);
          if (local_278[0].m_storage.m_cols != lVar16) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize
                      (local_278,6,lVar16);
            lVar16 = local_278[0].m_storage.m_cols;
          }
          if (0 < lVar16) {
            lVar9 = 0;
            pdVar10 = local_278[0].m_storage.m_data;
            do {
              pdVar13 = peVar7 + lVar9 * iVar15;
              lVar6 = 0;
              pdVar18 = local_1b8;
              do {
                pdVar10[lVar6] =
                     pdVar13[lVar3 * 5] * *pdVar18 + pdVar13[lVar3 * 4] * pdVar18[-1] +
                     pdVar13[lVar3 * 3] * pdVar18[-2] +
                     pdVar13[lVar3 * 2] * pdVar18[-3] + pdVar13[lVar3] * pdVar18[-4] +
                     *pdVar13 * pdVar18[-5];
                lVar6 = lVar6 + 1;
                pdVar18 = pdVar18 + 6;
              } while (lVar6 != 6);
              lVar9 = lVar9 + 1;
              pdVar10 = pdVar10 + 6;
            } while (lVar9 != lVar16);
          }
        }
        bVar2 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        lVar16 = centroidalMomentumJacobian->m_cols;
        lVar3 = centroidalMomentumJacobian->m_rows;
        lVar9 = 1;
        if (bVar2) {
          lVar9 = lVar3;
        }
        lVar6 = 1;
        if (!bVar2) {
          lVar6 = lVar16;
        }
        if (0 < lVar3) {
          peVar8 = centroidalMomentumJacobian->m_storage;
          lVar17 = 0;
          pdVar10 = local_278[0].m_storage.m_data;
          do {
            lVar5 = lVar16;
            peVar12 = peVar8;
            peVar14 = pdVar10;
            if (0 < lVar16) {
              do {
                *peVar12 = *peVar14;
                peVar14 = peVar14 + 6;
                peVar12 = peVar12 + lVar9;
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
            }
            lVar17 = lVar17 + 1;
            pdVar10 = pdVar10 + 1;
            peVar8 = peVar8 + lVar6;
          } while (lVar17 != lVar3);
        }
      }
      else if (FVar1 == MIXED_REPRESENTATION) {
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-((Position *)local_278,pPVar4);
        iDynTree::Transform::Transform(local_c0,local_1e0,(Position *)local_278);
        iDynTree::Transform::asAdjointTransformWrench();
        lVar16 = centroidalMomentumJacobian->m_cols;
        if (centroidalMomentumJacobian->m_storageOrder == ColumnMajor) {
          iVar15 = centroidalMomentumJacobian->m_rows;
          lVar3 = 1;
        }
        else {
          iVar15 = 1;
          lVar3 = lVar16;
        }
        peVar7 = centroidalMomentumJacobian->m_storage;
        local_278[0].m_storage.m_data = (element_type *)0x0;
        local_278[0].m_storage.m_cols = 0;
        if (lVar16 != 0) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize
                    (local_278,6,lVar16);
          if (local_278[0].m_storage.m_cols != lVar16) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize
                      (local_278,6,lVar16);
            lVar16 = local_278[0].m_storage.m_cols;
          }
          if (0 < lVar16) {
            lVar9 = 0;
            pdVar10 = local_278[0].m_storage.m_data;
            do {
              pdVar13 = peVar7 + lVar9 * iVar15;
              lVar6 = 0;
              pdVar18 = local_1b8;
              do {
                pdVar10[lVar6] =
                     pdVar13[lVar3 * 5] * *pdVar18 + pdVar13[lVar3 * 4] * pdVar18[-1] +
                     pdVar13[lVar3 * 3] * pdVar18[-2] +
                     pdVar13[lVar3 * 2] * pdVar18[-3] + pdVar13[lVar3] * pdVar18[-4] +
                     *pdVar13 * pdVar18[-5];
                lVar6 = lVar6 + 1;
                pdVar18 = pdVar18 + 6;
              } while (lVar6 != 6);
              lVar9 = lVar9 + 1;
              pdVar10 = pdVar10 + 6;
            } while (lVar9 != lVar16);
          }
        }
        bVar2 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        lVar16 = centroidalMomentumJacobian->m_cols;
        lVar3 = centroidalMomentumJacobian->m_rows;
        lVar9 = 1;
        if (bVar2) {
          lVar9 = lVar3;
        }
        lVar6 = 1;
        if (!bVar2) {
          lVar6 = lVar16;
        }
        if (0 < lVar3) {
          peVar7 = centroidalMomentumJacobian->m_storage;
          lVar17 = 0;
          pdVar10 = local_278[0].m_storage.m_data;
          do {
            lVar5 = lVar16;
            peVar11 = peVar7;
            peVar8 = pdVar10;
            if (0 < lVar16) {
              do {
                *peVar11 = *peVar8;
                peVar8 = peVar8 + 6;
                peVar11 = peVar11 + lVar9;
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
            }
            lVar17 = lVar17 + 1;
            pdVar10 = pdVar10 + 1;
            peVar7 = peVar7 + lVar6;
          } while (lVar17 != lVar3);
        }
      }
      else {
        if (FVar1 != BODY_FIXED_REPRESENTATION) {
          return false;
        }
        iDynTree::Rotation::Identity();
        iDynTree::Rotation::inverse();
        iDynTree::Position::operator-(local_210,pPVar4);
        iDynTree::Rotation::operator*(local_1f8,(Position *)local_278);
        iDynTree::Transform::Transform(local_c0,local_1e0,(Position *)local_1f8);
        iDynTree::Transform::asAdjointTransformWrench();
        lVar16 = centroidalMomentumJacobian->m_cols;
        if (centroidalMomentumJacobian->m_storageOrder == ColumnMajor) {
          iVar15 = centroidalMomentumJacobian->m_rows;
          lVar3 = 1;
        }
        else {
          iVar15 = 1;
          lVar3 = lVar16;
        }
        peVar7 = centroidalMomentumJacobian->m_storage;
        local_278[0].m_storage.m_data = (element_type *)0x0;
        local_278[0].m_storage.m_cols = 0;
        if (lVar16 != 0) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize
                    (local_278,6,lVar16);
          if (local_278[0].m_storage.m_cols != lVar16) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize
                      (local_278,6,lVar16);
            lVar16 = local_278[0].m_storage.m_cols;
          }
          if (0 < lVar16) {
            lVar9 = 0;
            pdVar10 = local_278[0].m_storage.m_data;
            do {
              pdVar13 = peVar7 + lVar9 * iVar15;
              lVar6 = 0;
              pdVar18 = local_1b8;
              do {
                pdVar10[lVar6] =
                     pdVar13[lVar3 * 5] * *pdVar18 + pdVar13[lVar3 * 4] * pdVar18[-1] +
                     pdVar13[lVar3 * 3] * pdVar18[-2] +
                     pdVar13[lVar3 * 2] * pdVar18[-3] + pdVar13[lVar3] * pdVar18[-4] +
                     *pdVar13 * pdVar18[-5];
                lVar6 = lVar6 + 1;
                pdVar18 = pdVar18 + 6;
              } while (lVar6 != 6);
              lVar9 = lVar9 + 1;
              pdVar10 = pdVar10 + 6;
            } while (lVar9 != lVar16);
          }
        }
        bVar2 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        lVar16 = centroidalMomentumJacobian->m_cols;
        lVar3 = centroidalMomentumJacobian->m_rows;
        lVar9 = 1;
        if (bVar2) {
          lVar9 = lVar3;
        }
        lVar6 = 1;
        if (!bVar2) {
          lVar6 = lVar16;
        }
        if (0 < lVar3) {
          peVar8 = centroidalMomentumJacobian->m_storage;
          lVar17 = 0;
          pdVar10 = local_278[0].m_storage.m_data;
          do {
            lVar5 = lVar16;
            peVar12 = peVar8;
            peVar14 = pdVar10;
            if (0 < lVar16) {
              do {
                *peVar12 = *peVar14;
                peVar14 = peVar14 + 6;
                peVar12 = peVar12 + lVar9;
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
            }
            lVar17 = lVar17 + 1;
            pdVar10 = pdVar10 + 1;
            peVar8 = peVar8 + lVar6;
          } while (lVar17 != lVar3);
        }
      }
      free(local_278[0].m_storage.m_data);
      return true;
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentumJacobian",
               "Wrong size in input centroidalMomentumJacobian");
  }
  return false;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentumJacobian(MatrixView<double> centroidalMomentumJacobian)
{
    bool ok = (centroidalMomentumJacobian.rows() == 6)
        && (centroidalMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getCentroidalTotalMomentumJacobian",
                    "Wrong size in input centroidalMomentumJacobian");
        return false;
    }

    if (!getLinearAngularMomentumJacobian(centroidalMomentumJacobian))
    {
        return false;
    }

    // get CoM and base pose
    Position com = getCenterOfMassPosition();
    const Position& basePosition = pimpl->m_pos.worldBasePos().getPosition();
    const Rotation& A_R_B = pimpl->m_pos.worldBasePos().getRotation();

    switch (pimpl->m_frameVelRepr)
    {
    case BODY_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B). Here we want to
        // express the quantity in (G[B]).
        // J_G[B] = G[B]_X_B * J_B
        // where is G[B]_X_B is the adjoint wrench transformation

        Transform com_T_base_in_base(Rotation::Identity(), A_R_B.inverse() * (basePosition - com));

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_base.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case MIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B[A]). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_B[A] * J_B[A]
        // where is G[A]_X_B[A] is the adjoint wrench transformation

        Transform com_T_base_in_inertial(Rotation::Identity(), basePosition - com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case INERTIAL_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (A). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_A * J_A
        // where is G[A]_X_A is the adjoint wrench transformation
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);

        iDynTree::Transform com_T_inertial(Rotation::Identity(),  -com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    default:
        assert(false);
        return false;
    }

    return true;
}